

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin_open(char *filename,int rwmode,int *handle)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  char cbuff;
  int status;
  int in_stack_00000010;
  int in_stack_000003f0;
  int *in_stack_00000b38;
  int in_stack_00000b44;
  char *in_stack_00000b48;
  int *in_stack_00001650;
  char *in_stack_00001658;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  if (stdin_outfile[0] == '\0') {
    iVar3 = fgetc(_stdin);
    cVar1 = (char)iVar3;
    ungetc((int)cVar1,_stdin);
    if ((cVar1 == '\x1f') || (cVar1 == 'K')) {
      iVar2 = mem_compress_stdin_open
                        ((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar2
                         ,(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
    else if (in_ESI == 0) {
      iVar2 = mem_createmem((ulong)in_stack_ffffffffffffffe8,in_RDX);
      if (iVar2 == 0) {
        iVar2 = stdin2mem(in_stack_00000010);
        if (iVar2 != 0) {
          ffpmsg((char *)0x11e41d);
          free(memTable[*in_RDX].memaddr);
        }
      }
      else {
        ffpmsg((char *)0x11e3f0);
      }
    }
    else {
      ffpmsg((char *)0x11e3c0);
      iVar2 = 0x70;
    }
  }
  else {
    iVar2 = file_create(in_stack_00001658,in_stack_00001650);
    if (iVar2 == 0) {
      iVar2 = stdin2file(in_stack_000003f0);
      file_close(0x11e30c);
      if (iVar2 == 0) {
        iVar2 = file_open(in_stack_00000b48,in_stack_00000b44,in_stack_00000b38);
      }
      else {
        ffpmsg((char *)0x11e31f);
        ffpmsg((char *)0x11e32b);
      }
    }
    else {
      ffpmsg((char *)0x11e2d7);
      ffpmsg((char *)0x11e2e3);
    }
  }
  return iVar2;
}

Assistant:

int stdin_open(char *filename, int rwmode, int *handle)
/*
  open a FITS file from the stdin file stream by copying it into memory
  The file name is ignored in this case.
*/
{
    int status;
    char cbuff;

    if (*stdin_outfile)
    {
      /* copy the stdin stream to the specified disk file then open the file */

      /* Create the output file */
      status =  file_create(stdin_outfile,handle);

      if (status)
      {
        ffpmsg("Unable to create output file to copy stdin (stdin_open):");
        ffpmsg(stdin_outfile);
        return(status);
      }
 
      /* copy the whole stdin stream to the file */
      status = stdin2file(*handle);
      file_close(*handle);

      if (status)
      {
        ffpmsg("failed to copy stdin to file (stdin_open)");
        ffpmsg(stdin_outfile);
        return(status);
      }

      /* reopen file with proper rwmode attribute */
      status = file_open(stdin_outfile, rwmode, handle);
    }
    else
    {
   
      /* get the first character, then put it back */
      cbuff = fgetc(stdin);
      ungetc(cbuff, stdin);
    
      /* compressed files begin with 037 or 'P' */
      if (cbuff == 31 || cbuff == 75)
      {
         /* looks like the input stream is compressed */
         status = mem_compress_stdin_open(filename, rwmode, handle);
	 
      }
      else
      {
        /* copy the stdin stream into memory then open file in memory */

        if (rwmode != READONLY)
        {
          ffpmsg("cannot open stdin with WRITE access");
          return(READONLY_FILE);
        }

        status = mem_createmem(2880L, handle);

        if (status)
        {
          ffpmsg("failed to create empty memory file (stdin_open)");
          return(status);
        }
 
        /* copy the whole stdin stream into memory */
        status = stdin2mem(*handle);

        if (status)
        {
          ffpmsg("failed to copy stdin into memory (stdin_open)");
          free(memTable[*handle].memaddr);
        }
      }
    }

    return(status);
}